

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadCompressedInts<unsigned_int>
          (CrateReader *this,uint *out,size_t num_ints)

{
  bool bVar1;
  ostream *poVar2;
  void *__new_size;
  ulong uVar3;
  ssize_t sVar4;
  size_t sVar5;
  unsigned_long *in_R8;
  uint64_t compSize;
  vector<char,_std::allocator<char>_> compBuffer;
  ostringstream ss_e;
  void *local_1f8;
  undefined1 local_1f0 [8];
  undefined1 local_1e8 [32];
  string local_1c8;
  ostringstream local_1a8 [376];
  
  local_1f0 = (undefined1  [8])num_ints;
  if ((this->_config).maxInts < num_ints) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadCompressedInts");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x12f);
    ::std::operator<<(poVar2," ");
    ::std::__cxx11::string::string
              ((string *)local_1e8,"# of ints {} too large. maxInts is set to {}",
               (allocator *)&local_1f8);
    fmt::format<unsigned_long,unsigned_long>
              (&local_1c8,(fmt *)local_1e8,(string *)local_1f0,&(this->_config).maxInts,in_R8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,(string *)&local_1c8);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
  }
  else {
    __new_size = (void *)Usd_IntegerCompression::GetCompressedBufferSize(num_ints);
    uVar3 = this->_memoryUsage + (long)__new_size;
    this->_memoryUsage = uVar3;
    if (uVar3 <= (this->_config).maxMemoryBudget) {
      bVar1 = StreamReader::read8(this->_sr,(uint64_t *)&local_1f8);
      if (!bVar1) {
        return false;
      }
      if (__new_size < local_1f8) {
        local_1f8 = __new_size;
      }
      if ((void *)0x3 < local_1f8) {
        if (local_1f8 <= (void *)this->_sr->length_) {
          local_1e8._0_8_ = (char *)0x0;
          local_1e8._8_8_ = 0;
          local_1e8._16_8_ = 0;
          ::std::vector<char,_std::allocator<char>_>::resize
                    ((vector<char,_std::allocator<char>_> *)local_1e8,(size_type)__new_size);
          sVar4 = StreamReader::read(this->_sr,(int)local_1f8,local_1f8,local_1e8._0_8_);
          if (sVar4 == 0) {
            ::std::__cxx11::ostringstream::ostringstream(local_1a8);
            poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
            poVar2 = ::std::operator<<(poVar2,
                                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                      );
            poVar2 = ::std::operator<<(poVar2,"[Crate]");
            poVar2 = ::std::operator<<(poVar2,":");
            poVar2 = ::std::operator<<(poVar2,"ReadCompressedInts");
            poVar2 = ::std::operator<<(poVar2,"():");
            poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x153);
            ::std::operator<<(poVar2," ");
            poVar2 = ::std::operator<<((ostream *)local_1a8,"Failed to read compressedInts.");
            ::std::operator<<(poVar2,"\n");
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)&this->_err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
            bVar1 = false;
          }
          else {
            sVar5 = Usd_IntegerCompression::DecompressFromBuffer
                              ((char *)local_1e8._0_8_,(size_t)local_1f8,out,num_ints,&this->_err,
                               (char *)0x0);
            bVar1 = sVar5 != 0;
            if ((void *)this->_memoryUsage < __new_size) {
              this->_memoryUsage = (long)this->_memoryUsage - (long)__new_size;
            }
          }
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)local_1e8);
          return bVar1;
        }
        return false;
      }
      return false;
    }
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar2 = ::std::operator<<((ostream *)local_1a8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,"[Crate]");
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReadCompressedInts");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x139);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1a8,"Reached to max memory budget.");
    ::std::operator<<(poVar2,"\n");
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::append((string *)&this->_err);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return false;
}

Assistant:

bool CrateReader::ReadCompressedInts(Int *out,
                                     size_t num_ints) {
  if (num_ints > _config.maxInts) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("# of ints {} too large. maxInts is set to {}", num_ints, _config.maxInts));
  }

  using Compressor =
      typename std::conditional<sizeof(Int) == 4, Usd_IntegerCompression,
                                Usd_IntegerCompression64>::type;


  // TODO: Read compressed data from _sr directly
  size_t compBufferSize = Compressor::GetCompressedBufferSize(num_ints);
  CHECK_MEMORY_USAGE(compBufferSize);

  uint64_t compSize;
  if (!_sr->read8(&compSize)) {
    return false;
  }

  if (compSize > compBufferSize) {
    // Truncate
    // TODO: return error?
    compSize = compBufferSize;
  }

  if (compSize > _sr->size()) {
    return false;
  }

  if (compSize < 4) {
    // Too small
    return false;
  }

  std::vector<char> compBuffer;
  compBuffer.resize(compBufferSize);
  if (!_sr->read(size_t(compSize), size_t(compSize),
                reinterpret_cast<uint8_t *>(compBuffer.data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read compressedInts.");
  }

  bool ret = Compressor::DecompressFromBuffer(
      compBuffer.data(), size_t(compSize), out, num_ints, &_err);

  REDUCE_MEMORY_USAGE(compBufferSize);

  return ret;
}